

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parquet.cpp
# Opt level: O0

ParquetColumnDefinition * duckdb::ParquetColumnDefinition::Deserialize(Deserializer *deserializer)

{
  ParquetColumnDefinition *in_RDI;
  ParquetColumnDefinition *result;
  int *in_stack_ffffffffffffff68;
  ParquetColumnDefinition *ret;
  Deserializer *in_stack_ffffffffffffff80;
  field_id_t in_stack_ffffffffffffff8e;
  Deserializer *in_stack_ffffffffffffff90;
  Value *in_stack_ffffffffffffff98;
  Value *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa8;
  field_id_t in_stack_ffffffffffffffae;
  Deserializer *in_stack_ffffffffffffffb0;
  field_id_t in_stack_ffffffffffffffbe;
  ParquetColumnDefinition *in_stack_ffffffffffffffc0;
  
  ret = in_RDI;
  ParquetColumnDefinition(in_stack_ffffffffffffffc0);
  Deserializer::ReadPropertyWithDefault<int>
            (in_stack_ffffffffffffff80,(field_id_t)((ulong)ret >> 0x30),(char *)in_RDI,
             in_stack_ffffffffffffff68);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffae,(char *)in_stack_ffffffffffffffa0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff98);
  Deserializer::ReadProperty<duckdb::LogicalType>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e,(char *)in_stack_ffffffffffffff80,
             (LogicalType *)ret);
  Deserializer::ReadProperty<duckdb::Value>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffae,(char *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff80,SQLNULL);
  duckdb::Value::Value((Value *)&stack0xffffffffffffff98,&stack0xffffffffffffff80);
  Deserializer::ReadPropertyWithExplicitDefault<duckdb::Value>
            ((Deserializer *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe,
             (char *)in_stack_ffffffffffffffb0,
             (Value *)CONCAT26(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffa0);
  duckdb::Value::~Value((Value *)&stack0xffffffffffffff98);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff80);
  return in_RDI;
}

Assistant:

ParquetColumnDefinition ParquetColumnDefinition::Deserialize(Deserializer &deserializer) {
	ParquetColumnDefinition result;
	deserializer.ReadPropertyWithDefault<int32_t>(100, "field_id", result.field_id);
	deserializer.ReadPropertyWithDefault<string>(101, "name", result.name);
	deserializer.ReadProperty<LogicalType>(103, "type", result.type);
	deserializer.ReadProperty<Value>(104, "default_value", result.default_value);
	deserializer.ReadPropertyWithExplicitDefault<Value>(105, "identifier", result.identifier, Value());
	return result;
}